

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::StructurePattern::FieldPattern>::
emplaceRealloc<slang::ast::StructurePattern::FieldPattern>
          (SmallVectorBase<slang::ast::StructurePattern::FieldPattern> *this,pointer pos,
          FieldPattern *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  Pattern *pPVar3;
  FieldPattern *__cur_1;
  pointer pFVar4;
  pointer pFVar5;
  pointer pFVar6;
  pointer pFVar7;
  EVP_PKEY_CTX *pEVar8;
  EVP_PKEY_CTX *ctx;
  long lVar9;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar8 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar8 < ctx) {
    pEVar8 = ctx;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    pEVar8 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar9 = (long)pos - (long)this->data_;
  pFVar4 = (pointer)operator_new((long)pEVar8 << 4);
  pPVar3 = (args->pattern).ptr;
  *(undefined8 *)((long)pFVar4 + lVar9) = (args->field).ptr;
  ((undefined8 *)((long)pFVar4 + lVar9))[1] = pPVar3;
  pFVar7 = this->data_;
  pFVar5 = pFVar7 + this->len;
  pFVar6 = pFVar4;
  if (pFVar5 == pos) {
    for (; pFVar7 != pos; pFVar7 = pFVar7 + 1) {
      pPVar3 = (pFVar7->pattern).ptr;
      (pFVar6->field).ptr = (pFVar7->field).ptr;
      (pFVar6->pattern).ptr = pPVar3;
      pFVar6 = pFVar6 + 1;
    }
  }
  else {
    for (; pFVar7 != pos; pFVar7 = pFVar7 + 1) {
      pPVar3 = (pFVar7->pattern).ptr;
      (pFVar6->field).ptr = (pFVar7->field).ptr;
      (pFVar6->pattern).ptr = pPVar3;
      pFVar6 = pFVar6 + 1;
    }
    puVar2 = (undefined8 *)(lVar9 + (long)pFVar4);
    for (; pos != pFVar5; pos = pos + 1) {
      pPVar3 = (pos->pattern).ptr;
      puVar2[2] = (pos->field).ptr;
      puVar2[3] = pPVar3;
      puVar2 = puVar2 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar8;
  this->data_ = pFVar4;
  return (pointer)((long)pFVar4 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}